

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O0

void poly1305_min_reduce(uint32_t *x)

{
  uint32_t uVar1;
  int local_18;
  uint local_14;
  int i;
  uint32_t carry;
  uint32_t *x_local;
  
  local_14 = 0;
  for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
    uVar1 = x[local_18];
    x[local_18] = uVar1 + local_14 & 0xff;
    local_14 = uVar1 + local_14 >> 8;
  }
  uVar1 = x[0x10];
  x[0x10] = uVar1 + local_14 & 3;
  local_14 = (uVar1 + local_14 >> 2) * 5;
  for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
    uVar1 = x[local_18];
    x[local_18] = uVar1 + local_14 & 0xff;
    local_14 = uVar1 + local_14 >> 8;
  }
  x[0x10] = local_14 + x[0x10];
  return;
}

Assistant:

static void poly1305_min_reduce(uint32_t x[17])
{
  uint32_t carry = 0;
  int i;
  for (i = 0; i < 16; i++)
  {
    carry += x[i];
    x[i] = carry & 0xff;
    carry >>= 8;
  }

  /* 2 ** 130 - 5 = 0x3fffffffffffffffffffffffffffffffb
   *                  ^
   * So 2 bits of carry are put into top word.
   * Remaining bits get multiplied by 5 and carried back
   * into bottom */
  carry += x[16];
  x[16] = carry & 0x03;
  carry = 5 * (carry >> 2);

  for (i = 0; i < 16; i++)
  {
    carry += x[i];
    x[i] = carry & 0xff;
    carry >>= 8;
  }

  x[16] += carry;
}